

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osscurses.cc
# Opt level: O0

int oss_eof_on_stdin(void)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  timeval tv;
  fd_set rfds;
  uint local_94;
  timeval local_90;
  fd_set local_80;
  
  local_90.tv_sec = 0;
  local_90.tv_usec = 0;
  for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
    local_80.fds_bits[local_94] = 0;
  }
  local_80.fds_bits[0] = local_80.fds_bits[0] | 1;
  iVar1 = select(1,&local_80,(fd_set *)0x0,(fd_set *)0x0,&local_90);
  return (int)(iVar1 == -1);
}

Assistant:

int
oss_eof_on_stdin()
{
#ifndef MSDOS
    fd_set rfds;
    timeval tv;

    // Zero time: non-blocking operation.
    tv.tv_sec = 0;
    tv.tv_usec = 0;

    FD_ZERO(&rfds);
    // stdin always has a file descriptor of 0.
    FD_SET(0, &rfds);

    return select(1, &rfds, 0, 0, &tv) == -1;
#else
    return _eof(_fileno(stdin)) > 0;
#endif
}